

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<std::__cxx11::string>::emplace_back<std::__cxx11::string>
          (SmallVectorBase<std::__cxx11::string> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  reference pbVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  pointer pcVar5;
  ulong uVar6;
  undefined8 uVar7;
  void *pvVar8;
  long *plVar9;
  long *plVar10;
  long lVar11;
  long *plVar12;
  long lVar13;
  ulong uVar14;
  long *plVar15;
  reference pbVar16;
  long lVar17;
  
  plVar15 = (long *)(*(long *)(this + 8) * 0x20 + *(long *)this);
  if (*(long *)(this + 8) != *(long *)(this + 0x10)) {
    *plVar15 = (long)(plVar15 + 2);
    pcVar5 = (args->_M_dataplus)._M_p;
    paVar1 = &args->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 == paVar1) {
      lVar17 = *(long *)((long)&args->field_2 + 8);
      plVar15[2] = paVar1->_M_allocated_capacity;
      plVar15[3] = lVar17;
    }
    else {
      *plVar15 = (long)pcVar5;
      plVar15[2] = paVar1->_M_allocated_capacity;
    }
    plVar15[1] = args->_M_string_length;
    (args->_M_dataplus)._M_p = (pointer)paVar1;
    args->_M_string_length = 0;
    (args->field_2)._M_local_buf[0] = '\0';
    lVar17 = *(long *)(this + 8);
    *(long *)(this + 8) = lVar17 + 1;
    return (reference)(*(long *)this + (lVar17 + 1) * 0x20 + -0x20);
  }
  if (*(long *)(this + 8) == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar14 = *(long *)(this + 8) + 1;
  uVar6 = *(ulong *)(this + 0x10);
  if (uVar14 < uVar6 * 2) {
    uVar14 = uVar6 * 2;
  }
  if (0x3ffffffffffffff - uVar6 < uVar6) {
    uVar14 = 0x3ffffffffffffff;
  }
  lVar17 = (long)plVar15 - *(long *)this;
  pvVar8 = operator_new(uVar14 << 5);
  pbVar2 = (reference)((long)pvVar8 + lVar17);
  puVar3 = (undefined8 *)((long)pvVar8 + lVar17);
  *puVar3 = puVar3 + 2;
  pcVar5 = (args->_M_dataplus)._M_p;
  paVar1 = &args->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar1) {
    uVar7 = *(undefined8 *)((long)&args->field_2 + 8);
    puVar3[2] = paVar1->_M_allocated_capacity;
    puVar3[3] = uVar7;
  }
  else {
    (pbVar2->_M_dataplus)._M_p = pcVar5;
    (pbVar2->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  pbVar2->_M_string_length = args->_M_string_length;
  (args->_M_dataplus)._M_p = (pointer)paVar1;
  args->_M_string_length = 0;
  (args->field_2)._M_local_buf[0] = '\0';
  plVar10 = *(long **)this;
  lVar11 = *(long *)(this + 8);
  pbVar16 = pbVar2;
  if (plVar10 + lVar11 * 4 == plVar15) {
    if (lVar11 != 0) {
      plVar12 = (long *)((long)pvVar8 + 0x10);
      plVar10 = plVar10 + 2;
      do {
        plVar12[-2] = (long)plVar12;
        if (plVar10 == (long *)plVar10[-2]) {
          lVar17 = plVar10[1];
          *plVar12 = *plVar10;
          plVar12[1] = lVar17;
        }
        else {
          plVar12[-2] = plVar10[-2];
          *plVar12 = *plVar10;
        }
        plVar12[-1] = plVar10[-1];
        plVar10[-2] = (long)plVar10;
        plVar10[-1] = 0;
        *(undefined1 *)plVar10 = 0;
        plVar12 = plVar12 + 4;
        plVar9 = plVar10 + 2;
        plVar10 = plVar10 + 4;
      } while (plVar9 != plVar15);
    }
  }
  else {
    if (plVar10 != plVar15) {
      plVar12 = (long *)((long)pvVar8 + 0x10);
      plVar10 = plVar10 + 2;
      do {
        plVar12[-2] = (long)plVar12;
        if (plVar10 == (long *)plVar10[-2]) {
          lVar11 = plVar10[1];
          *plVar12 = *plVar10;
          plVar12[1] = lVar11;
        }
        else {
          plVar12[-2] = plVar10[-2];
          *plVar12 = *plVar10;
        }
        plVar12[-1] = plVar10[-1];
        plVar10[-2] = (long)plVar10;
        plVar10[-1] = 0;
        *(undefined1 *)plVar10 = 0;
        plVar12 = plVar12 + 4;
        plVar9 = plVar10 + 2;
        plVar10 = plVar10 + 4;
      } while (plVar9 != plVar15);
      plVar10 = *(long **)this;
      lVar11 = *(long *)(this + 8);
    }
    if (plVar10 + lVar11 * 4 != plVar15) {
      lVar13 = 0;
      do {
        puVar3 = (undefined8 *)((long)pvVar8 + lVar13 + lVar17 + 0x30);
        *(undefined8 **)((long)pvVar8 + lVar13 + lVar17 + 0x20) = puVar3;
        puVar4 = (undefined8 *)((long)plVar15 + lVar13);
        pbVar16 = (reference)(puVar4 + 2);
        if (pbVar16 == (reference)*puVar4) {
          uVar7 = puVar4[3];
          *puVar3 = (pbVar16->_M_dataplus)._M_p;
          puVar3[1] = uVar7;
        }
        else {
          *(reference *)((long)pvVar8 + lVar13 + lVar17 + 0x20) = (reference)*puVar4;
          *(pointer *)((long)pvVar8 + lVar13 + lVar17 + 0x30) = (pbVar16->_M_dataplus)._M_p;
        }
        puVar3 = (undefined8 *)((long)plVar15 + lVar13);
        *(undefined8 *)((long)pvVar8 + lVar13 + lVar17 + 0x28) = puVar3[1];
        *puVar3 = pbVar16;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        lVar13 = lVar13 + 0x20;
      } while (puVar3 + 4 != plVar10 + lVar11 * 4);
    }
  }
  SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::cleanup((SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this,(EVP_PKEY_CTX *)pbVar16);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = uVar14;
  *(void **)this = pvVar8;
  return pbVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }